

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,float *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  bool local_99;
  int iStack_94;
  bool rc;
  int wi;
  int i;
  double w;
  float local_80;
  ON_3fPoint Q;
  ON_3dPoint P;
  ON_BoundingBox bbox;
  ON_BoundingBox *tight_bbox_local;
  float *points_local;
  int local_18;
  int stride_local;
  int count_local;
  bool is_rat_local;
  int dim_local;
  
  bbox.m_max.z = (double)tight_bbox;
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&P.z);
  ON_3dPoint::ON_3dPoint((ON_3dPoint *)&Q.y,0.0,0.0,0.0);
  ON_3fPoint::ON_3fPoint((ON_3fPoint *)((long)&w + 4),0.0,0.0,0.0);
  if ((bGrowBox != 0) && (bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)bbox.m_max.z), !bVar1))
  {
    bGrowBox = 0;
  }
  if (bGrowBox == 0) {
    ON_BoundingBox::Destroy((ON_BoundingBox *)bbox.m_max.z);
  }
  stride_local._3_1_ = is_rat;
  if (is_rat) {
    stride_local._3_1_ = 1;
  }
  if ((((count < 1) || (dim < 1)) || (points == (float *)0x0)) ||
     ((count != 1 && (stride < (int)(dim + (uint)(stride_local._3_1_ & 1)))))) {
    local_99 = bGrowBox != 0 && count == 0;
    is_rat_local = local_99;
  }
  else {
    if ((xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsIdentity(xform,0.0), bVar1)) {
      xform = (ON_Xform *)0x0;
    }
    count_local = dim;
    if (3 < dim) {
      count_local = 3;
    }
    is_rat_local = true;
    tight_bbox_local = (ON_BoundingBox *)points;
    local_18 = count;
    if ((stride_local._3_1_ & 1) != 0) {
      while( true ) {
        bVar1 = false;
        if (0 < local_18) {
          bVar1 = *(float *)((long)&(tight_bbox_local->m_min).x + (long)dim * 4) == 0.0;
        }
        if (!bVar1) break;
        local_18 = local_18 + -1;
        tight_bbox_local = (ON_BoundingBox *)((long)&(tight_bbox_local->m_min).x + (long)stride * 4)
        ;
        is_rat_local = false;
      }
      if (local_18 < 1) {
        return false;
      }
    }
    if (bGrowBox == 0) {
      memcpy((void *)((long)&w + 4),tight_bbox_local,(long)count_local << 2);
      ON_3dPoint::operator=((ON_3dPoint *)&P.z,(ON_3fPoint *)((long)&w + 4));
      if ((stride_local._3_1_ & 1) != 0) {
        dVar3 = 1.0 / (double)*(float *)((long)&(tight_bbox_local->m_min).x + (long)dim * 4);
        P.z = dVar3 * P.z;
        bbox.m_min.x = dVar3 * bbox.m_min.x;
        bbox.m_min.y = dVar3 * bbox.m_min.y;
      }
      if (xform != (ON_Xform *)0x0) {
        ON_3dPoint::Transform((ON_3dPoint *)&P.z,xform);
      }
      bbox.m_min.z = P.z;
      bbox.m_max.x = bbox.m_min.x;
      bbox.m_max.y = bbox.m_min.y;
      tight_bbox_local = (ON_BoundingBox *)((long)&(tight_bbox_local->m_min).x + (long)stride * 4);
      local_18 = local_18 + -1;
    }
    if (0 < local_18) {
      if ((stride_local._3_1_ & 1) == 0) {
        if (xform == (ON_Xform *)0x0) {
          while (local_18 != 0) {
            memcpy((void *)((long)&w + 4),tight_bbox_local,(long)count_local << 2);
            Q._4_8_ = (BADTYPE)w._4_4_;
            P.x = (double)local_80;
            P.y = (double)Q.x;
            dVar3 = (double)Q._4_8_;
            if ((P.z <= (double)Q._4_8_) && (dVar3 = P.z, bbox.m_min.z < (double)Q._4_8_)) {
              bbox.m_min.z = (double)Q._4_8_;
            }
            P.z = dVar3;
            dVar3 = P.x;
            if ((bbox.m_min.x <= P.x) && (dVar3 = bbox.m_min.x, bbox.m_max.x < P.x)) {
              bbox.m_max.x = P.x;
            }
            bbox.m_min.x = dVar3;
            dVar3 = P.y;
            if ((bbox.m_min.y <= P.y) && (dVar3 = bbox.m_min.y, bbox.m_max.y < P.y)) {
              bbox.m_max.y = P.y;
            }
            bbox.m_min.y = dVar3;
            tight_bbox_local =
                 (ON_BoundingBox *)((long)&(tight_bbox_local->m_min).x + (long)stride * 4);
            local_18 = local_18 + -1;
          }
        }
        else {
          while (local_18 != 0) {
            memcpy((void *)((long)&w + 4),tight_bbox_local,(long)count_local << 2);
            Q._4_8_ = (BADTYPE)w._4_4_;
            P.x = (double)local_80;
            P.y = (double)Q.x;
            ON_3dPoint::Transform((ON_3dPoint *)&Q.y,xform);
            if (P.z <= (double)Q._4_8_) {
              if (bbox.m_min.z < (double)Q._4_8_) {
                bbox.m_min.z = (double)Q._4_8_;
              }
            }
            else {
              P.z = (double)Q._4_8_;
            }
            if (bbox.m_min.x <= P.x) {
              if (bbox.m_max.x < P.x) {
                bbox.m_max.x = P.x;
              }
            }
            else {
              bbox.m_min.x = P.x;
            }
            if (bbox.m_min.y <= P.y) {
              if (bbox.m_max.y < P.y) {
                bbox.m_max.y = P.y;
              }
            }
            else {
              bbox.m_min.y = P.y;
            }
            tight_bbox_local =
                 (ON_BoundingBox *)((long)&(tight_bbox_local->m_min).x + (long)stride * 4);
            local_18 = local_18 + -1;
          }
          if (count_local < 3) {
            for (iStack_94 = count_local; iStack_94 < 3; iStack_94 = iStack_94 + 1) {
              pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&P.z,iStack_94);
              *pdVar2 = 0.0;
              pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&bbox.m_min.z,iStack_94);
              *pdVar2 = 0.0;
            }
          }
        }
      }
      else if (xform == (ON_Xform *)0x0) {
        while (local_18 != 0) {
          dVar3 = (double)*(float *)((long)&(tight_bbox_local->m_min).x + (long)dim * 4);
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            memcpy((void *)((long)&w + 4),tight_bbox_local,(long)count_local << 2);
            dVar3 = 1.0 / dVar3;
            Q._4_8_ = dVar3 * (double)w._4_4_;
            P.x = dVar3 * (double)local_80;
            P.y = dVar3 * (double)Q.x;
            dVar3 = (double)Q._4_8_;
            if ((P.z <= (double)Q._4_8_) && (dVar3 = P.z, bbox.m_min.z < (double)Q._4_8_)) {
              bbox.m_min.z = (double)Q._4_8_;
            }
            P.z = dVar3;
            dVar3 = P.x;
            if ((bbox.m_min.x <= P.x) && (dVar3 = bbox.m_min.x, bbox.m_max.x < P.x)) {
              bbox.m_max.x = P.x;
            }
            bbox.m_min.x = dVar3;
            dVar3 = P.y;
            if ((bbox.m_min.y <= P.y) && (dVar3 = bbox.m_min.y, bbox.m_max.y < P.y)) {
              bbox.m_max.y = P.y;
            }
          }
          else {
            is_rat_local = false;
            dVar3 = bbox.m_min.y;
          }
          bbox.m_min.y = dVar3;
          tight_bbox_local =
               (ON_BoundingBox *)((long)&(tight_bbox_local->m_min).x + (long)stride * 4);
          local_18 = local_18 + -1;
        }
      }
      else {
        while (local_18 != 0) {
          dVar3 = (double)*(float *)((long)&(tight_bbox_local->m_min).x + (long)dim * 4);
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            memcpy((void *)((long)&w + 4),tight_bbox_local,(long)count_local << 2);
            dVar3 = 1.0 / dVar3;
            Q._4_8_ = dVar3 * (double)w._4_4_;
            P.x = dVar3 * (double)local_80;
            P.y = dVar3 * (double)Q.x;
            ON_3dPoint::Transform((ON_3dPoint *)&Q.y,xform);
            if (P.z <= (double)Q._4_8_) {
              if (bbox.m_min.z < (double)Q._4_8_) {
                bbox.m_min.z = (double)Q._4_8_;
              }
            }
            else {
              P.z = (double)Q._4_8_;
            }
            if (bbox.m_min.x <= P.x) {
              if (bbox.m_max.x < P.x) {
                bbox.m_max.x = P.x;
              }
            }
            else {
              bbox.m_min.x = P.x;
            }
            if (bbox.m_min.y <= P.y) {
              if (bbox.m_max.y < P.y) {
                bbox.m_max.y = P.y;
              }
            }
            else {
              bbox.m_min.y = P.y;
            }
          }
          else {
            is_rat_local = false;
          }
          tight_bbox_local =
               (ON_BoundingBox *)((long)&(tight_bbox_local->m_min).x + (long)stride * 4);
          local_18 = local_18 + -1;
        }
        if (count_local < 3) {
          for (iStack_94 = count_local; iStack_94 < 3; iStack_94 = iStack_94 + 1) {
            pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&P.z,iStack_94);
            *pdVar2 = 0.0;
            pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&bbox.m_min.z,iStack_94);
            *pdVar2 = 0.0;
          }
        }
      }
    }
    ON_BoundingBox::Union((ON_BoundingBox *)bbox.m_max.z,(ON_BoundingBox *)&P.z);
  }
  return is_rat_local;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const float* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  ON_BoundingBox bbox;
  ON_3dPoint P(0.0,0.0,0.0);
  ON_3fPoint Q(0.0,0.0,0.0);
  double w;
  int i, wi;
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0f ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    if ( !bGrowBox  )
    {
      memcpy( &Q.x, points, dim*sizeof(Q.x) );
      bbox.m_min = Q;
      if ( is_rat )
      {
        w = 1.0/points[wi];
        bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
      }
      if ( xform )
      {
        bbox.m_min.Transform(*xform);
      }
      bbox.m_max = bbox.m_min;
      points += stride;
      count--;
      bGrowBox = true;
    }

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            w = 1.0/w;
            P.x = w*Q.x; P.y = w*Q.y; P.z = w*Q.z;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            w = 1.0/w;
            P.x = w*Q.x; P.y = w*Q.y; P.z = w*Q.z;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            P.x = Q.x; P.y = Q.y; P.z = Q.z;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            P.x = Q.x; P.y = Q.y; P.z = Q.z;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}